

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointObservationDiscrete.cpp
# Opt level: O0

string * __thiscall
JointObservationDiscrete::SoftPrintBrief_abi_cxx11_(JointObservationDiscrete *this)

{
  bool bVar1;
  reference ppOVar2;
  string *in_RDI;
  const_iterator last;
  const_iterator it;
  stringstream ss;
  ostream *in_stack_fffffffffffffdf8;
  string *this_00;
  string local_1c8 [32];
  ObservationDiscrete **local_1a8;
  __normal_iterator<const_ObservationDiscrete_*const_*,_std::vector<const_ObservationDiscrete_*,_std::allocator<const_ObservationDiscrete_*>_>_>
  local_1a0;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  this_00 = in_RDI;
  std::__cxx11::stringstream::stringstream(local_198);
  local_1a0._M_current =
       (ObservationDiscrete **)
       std::vector<const_ObservationDiscrete_*,_std::allocator<const_ObservationDiscrete_*>_>::begin
                 ((vector<const_ObservationDiscrete_*,_std::allocator<const_ObservationDiscrete_*>_>
                   *)in_stack_fffffffffffffdf8);
  local_1a8 = (ObservationDiscrete **)
              std::vector<const_ObservationDiscrete_*,_std::allocator<const_ObservationDiscrete_*>_>
              ::end((vector<const_ObservationDiscrete_*,_std::allocator<const_ObservationDiscrete_*>_>
                     *)in_stack_fffffffffffffdf8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_ObservationDiscrete_*const_*,_std::vector<const_ObservationDiscrete_*,_std::allocator<const_ObservationDiscrete_*>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_ObservationDiscrete_*const_*,_std::vector<const_ObservationDiscrete_*,_std::allocator<const_ObservationDiscrete_*>_>_>
                             *)in_stack_fffffffffffffdf8), bVar1) {
    ppOVar2 = __gnu_cxx::
              __normal_iterator<const_ObservationDiscrete_*const_*,_std::vector<const_ObservationDiscrete_*,_std::allocator<const_ObservationDiscrete_*>_>_>
              ::operator*(&local_1a0);
    if (*ppOVar2 != (ObservationDiscrete *)0x0) {
      in_stack_fffffffffffffdf8 = local_188;
      ppOVar2 = __gnu_cxx::
                __normal_iterator<const_ObservationDiscrete_*const_*,_std::vector<const_ObservationDiscrete_*,_std::allocator<const_ObservationDiscrete_*>_>_>
                ::operator*(&local_1a0);
      (*((*ppOVar2)->super_Observation).super_NamedDescribedEntity._vptr_NamedDescribedEntity[3])
                (local_1c8);
      std::operator<<(in_stack_fffffffffffffdf8,local_1c8);
      std::__cxx11::string::~string(local_1c8);
    }
    __gnu_cxx::
    __normal_iterator<const_ObservationDiscrete_*const_*,_std::vector<const_ObservationDiscrete_*,_std::allocator<const_ObservationDiscrete_*>_>_>
    ::operator-((__normal_iterator<const_ObservationDiscrete_*const_*,_std::vector<const_ObservationDiscrete_*,_std::allocator<const_ObservationDiscrete_*>_>_>
                 *)this_00,(difference_type)in_RDI);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_ObservationDiscrete_*const_*,_std::vector<const_ObservationDiscrete_*,_std::allocator<const_ObservationDiscrete_*>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_ObservationDiscrete_*const_*,_std::vector<const_ObservationDiscrete_*,_std::allocator<const_ObservationDiscrete_*>_>_>
                        *)in_stack_fffffffffffffdf8);
    if (bVar1) {
      std::operator<<(local_188,"_");
    }
    __gnu_cxx::
    __normal_iterator<const_ObservationDiscrete_*const_*,_std::vector<const_ObservationDiscrete_*,_std::allocator<const_ObservationDiscrete_*>_>_>
    ::operator++((__normal_iterator<const_ObservationDiscrete_*const_*,_std::vector<const_ObservationDiscrete_*,_std::allocator<const_ObservationDiscrete_*>_>_>
                  *)this_00,(int)((ulong)in_RDI >> 0x20));
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return this_00;
}

Assistant:

string JointObservationDiscrete::SoftPrintBrief() const
{
    stringstream ss;
    vector<const ObservationDiscrete*>::const_iterator it =  _m_opVector.begin();
    vector<const ObservationDiscrete*>::const_iterator last =  _m_opVector.end();

    while(it != last)
    {
        if(*it != 0)
            ss << (*it)->SoftPrintBrief();
        if(it != last-1)
            ss << "_";

        it++;
    }
    return(ss.str());
}